

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O3

void do_cmd_tunnel(command *cmd)

{
  player *p;
  _Bool _Var1;
  wchar_t wVar2;
  loc grid;
  square *psVar3;
  wchar_t dir;
  int local_1c;
  
  wVar2 = cmd_get_direction((command_conflict *)cmd,"direction",&local_1c,false);
  if (wVar2 == L'\0') {
    grid = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[local_1c]);
    _Var1 = do_cmd_tunnel_test(player,grid);
    p = player;
    if (_Var1) {
      player->upkeep->energy_use = (uint)z_info->move_energy;
      _Var1 = player_confuse_dir(p,&local_1c,false);
      if (_Var1) {
        grid = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[local_1c]);
      }
      psVar3 = square(cave,grid);
      if (psVar3->mon < 1) {
        _Var1 = do_cmd_tunnel_aux(grid);
        if (_Var1) {
          return;
        }
      }
      else {
        msg("There is a monster in the way!");
        py_attack(player,grid);
      }
    }
    disturb(player);
  }
  return;
}

Assistant:

void do_cmd_tunnel(struct command *cmd)
{
	struct loc grid;
	int dir;
	bool more = false;

	/* Get arguments */
	if (cmd_get_direction(cmd, "direction", &dir, false))
		return;

	/* Get location */
	grid = loc_sum(player->grid, ddgrid[dir]);

	/* Oops */
	if (!do_cmd_tunnel_test(player, grid)) {
		/* Cancel repeat */
		disturb(player);
		return;
	}

	/* Take a turn */
	player->upkeep->energy_use = z_info->move_energy;

	/* Apply confusion */
	if (player_confuse_dir(player, &dir, false)) {
		/* Get location */
		grid = loc_sum(player->grid, ddgrid[dir]);
	}

	/* Attack any monster we run into */
	if (square(cave, grid)->mon > 0) {
		msg("There is a monster in the way!");
		py_attack(player, grid);
	} else {
		/* Tunnel through walls */
		more = do_cmd_tunnel_aux(grid);
	}

	/* Cancel repetition unless we can continue */
	if (!more) disturb(player);
}